

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msp430cpu.cpp
# Opt level: O0

int16_t __thiscall MSP430Cpu::bcd2bin(MSP430Cpu *this,int16_t data,bool is8Bit)

{
  undefined2 local_16;
  int16_t result;
  bool is8Bit_local;
  int16_t data_local;
  MSP430Cpu *this_local;
  
  if (is8Bit) {
    local_16 = ((short)(data & 0xffU) >> 4) * 10 + (data & 0xfU);
  }
  else {
    local_16 = (data >> 0xc) * 1000 + ((short)(char)((ushort)data >> 8) & 0xfU) * 100 +
               (data >> 4 & 0xfU) * 10 + (data & 0xfU);
  }
  return local_16;
}

Assistant:

int16_t MSP430Cpu::bcd2bin(int16_t data, bool is8Bit)
{
    int16_t result = 0;
    if (is8Bit) {
        data &= 0xff;
        result = (data >> 4) * 10 + (data & 0xf);
    } else {
        result = (data >> 12) * 1000 +
                 ((data >> 8) & 0xf) * 100 +
                 ((data >> 4) & 0xf) * 10 +
                 (data & 0xf);
    }
    return result;
}